

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>>
           (pair<int,_double> *param_1,pair<int,_double> *param_2)

{
  bool bVar1;
  reference ppVar2;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  *p_Var3;
  reference ppVar4;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>,_bool>
  pVar5;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  pivot_pos;
  bool already_partitioned;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  last;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  first;
  T pivot;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_ffffffffffffff68;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  byte in_stack_ffffffffffffff7f;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_70;
  pair<int,_double> *local_68;
  pair<int,_double> *local_60;
  undefined1 local_51;
  pair<int,_double> *local_50;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_48;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_40;
  pair<int,_double> local_38;
  pair<int,_double> *local_20;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_18 [3];
  
  local_20 = param_2;
  local_18[0]._M_current = param_1;
  ppVar2 = __gnu_cxx::
           __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
           ::operator*(local_18);
  local_38.first = ppVar2->first;
  local_38._4_4_ = *(undefined4 *)&ppVar2->field_0x4;
  local_38.second = ppVar2->second;
  local_40._M_current = local_18[0]._M_current;
  local_48._M_current = local_20;
  do {
    p_Var3 = __gnu_cxx::
             __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator++(&local_40);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
    ::operator*(p_Var3);
    bVar1 = std::less<std::pair<int,_double>_>::operator()
                      ((less<std::pair<int,_double>_> *)in_stack_ffffffffffffff70._M_current,
                       in_stack_ffffffffffffff68._M_current,(pair<int,_double> *)0x7a4d6d);
  } while (bVar1);
  local_50 = (pair<int,_double> *)
             __gnu_cxx::
             __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator-((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70._M_current);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                      *)in_stack_ffffffffffffff70._M_current,
                     (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                      *)in_stack_ffffffffffffff68._M_current);
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          *)in_stack_ffffffffffffff70._M_current,
                         (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          *)in_stack_ffffffffffffff68._M_current);
      in_stack_ffffffffffffff7f = 0;
      if (bVar1) {
        p_Var3 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                 ::operator--(&local_48);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
        ::operator*(p_Var3);
        bVar1 = std::less<std::pair<int,_double>_>::operator()
                          ((less<std::pair<int,_double>_> *)in_stack_ffffffffffffff70._M_current,
                           in_stack_ffffffffffffff68._M_current,(pair<int,_double> *)0x7a4de5);
        in_stack_ffffffffffffff7f = bVar1 ^ 0xff;
      }
    } while ((in_stack_ffffffffffffff7f & 1) != 0);
  }
  else {
    do {
      p_Var3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator--(&local_48);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
      ::operator*(p_Var3);
      bVar1 = std::less<std::pair<int,_double>_>::operator()
                        ((less<std::pair<int,_double>_> *)in_stack_ffffffffffffff70._M_current,
                         in_stack_ffffffffffffff68._M_current,(pair<int,_double> *)0x7a4e1f);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_51 = __gnu_cxx::operator>=
                       ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                         *)in_stack_ffffffffffffff70._M_current,
                        (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                         *)in_stack_ffffffffffffff68._M_current);
  while (bVar1 = __gnu_cxx::operator<
                           ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                             *)in_stack_ffffffffffffff70._M_current,
                            (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                             *)in_stack_ffffffffffffff68._M_current), bVar1) {
    local_60 = local_40._M_current;
    local_68 = local_48._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    do {
      p_Var3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator++(&local_40);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
      ::operator*(p_Var3);
      bVar1 = std::less<std::pair<int,_double>_>::operator()
                        ((less<std::pair<int,_double>_> *)in_stack_ffffffffffffff70._M_current,
                         in_stack_ffffffffffffff68._M_current,(pair<int,_double> *)0x7a4e9f);
    } while (bVar1);
    do {
      p_Var3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
               ::operator--(&local_48);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
      ::operator*(p_Var3);
      bVar1 = std::less<std::pair<int,_double>_>::operator()
                        ((less<std::pair<int,_double>_> *)in_stack_ffffffffffffff70._M_current,
                         in_stack_ffffffffffffff68._M_current,(pair<int,_double> *)0x7a4ecd);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_70 = __gnu_cxx::
             __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
             ::operator-((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70._M_current);
  p_Var3 = &local_70;
  ppVar2 = __gnu_cxx::
           __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
           ::operator*(p_Var3);
  ppVar4 = __gnu_cxx::
           __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
           ::operator*(local_18);
  std::pair<int,_double>::operator=(ppVar4,ppVar2);
  ppVar4 = __gnu_cxx::
           __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
           ::operator*(p_Var3);
  std::pair<int,_double>::operator=(ppVar4,&local_38);
  pVar5 = std::
          make_pair<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>&,bool&>
                    (p_Var3,(bool *)ppVar2);
  return pVar5;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }